

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall polyscope::render::Engine::loadDefaultMaterials(Engine *this)

{
  allocator local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"clay",&local_109);
  loadDefaultMaterial(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_48,"wax",&local_109);
  loadDefaultMaterial(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"candy",&local_109);
  loadDefaultMaterial(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,"flat",&local_109);
  loadDefaultMaterial(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,"mud",&local_109);
  loadDefaultMaterial(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"ceramic",&local_109);
  loadDefaultMaterial(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_e8,"jade",&local_109);
  loadDefaultMaterial(this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_108,"normal",&local_109);
  loadDefaultMaterial(this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

void Engine::loadDefaultMaterials() {
  loadDefaultMaterial("clay");
  loadDefaultMaterial("wax");
  loadDefaultMaterial("candy");
  loadDefaultMaterial("flat");
  loadDefaultMaterial("mud");
  loadDefaultMaterial("ceramic");
  loadDefaultMaterial("jade");
  loadDefaultMaterial("normal");
}